

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall aggreports::LoadPeriodsToWeighting(aggreports *this)

{
  size_t sVar1;
  bool *pbVar2;
  FILE *__stream;
  size_t sVar3;
  mapped_type_conflict *pmVar4;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  mapped_type_conflict local_48;
  Periods p;
  
  __stream = fopen("input/periods.bin","rb");
  if (__stream != (FILE *)0x0) {
    while( true ) {
      sVar3 = fread(&p,0xc,1,__stream);
      if (sVar3 == 0) break;
      local_48 = p.weighting;
      pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[](&this->periodstoweighting_,&p.period_no);
      *pmVar4 = local_48;
    }
    if ((this->outputFlags_[3] != false) || (this->outputFlags_[7] == true)) {
      sVar1 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if ((sVar1 == 0) || (this->useReturnPeriodFile_ != false)) {
        if ((sVar1 != 0) && (this->ordFlag_ == true)) {
          std::__cxx11::string::string((string *)&local_68,this->progname_,&local_89);
          std::__cxx11::string::string((string *)&local_88,"INFO",&local_8a);
          logprintf(&local_68,&local_88,
                    "Tail Value at Risk for Wheatsheaf mean/per sample mean is not supported if you wish to use non-uniform period weights..\n"
                   );
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_68);
        }
      }
      else {
        std::__cxx11::string::string((string *)&local_68,this->progname_,&local_89);
        std::__cxx11::string::string((string *)&local_88,"WARNING",&local_8a);
        logprintf(&local_68,&local_88,
                  "Return periods file must be present if you wish to use non-uniform period weights for Wheatsheaf mean/per sample mean output.\n"
                 );
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::string((string *)&local_68,this->progname_,&local_89);
        std::__cxx11::string::string((string *)&local_88,"INFO",&local_8a);
        logprintf(&local_68,&local_88,
                  "Wheatsheaf mean/per sample mean output will not be produced.\n");
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_68);
        pbVar2 = this->outputFlags_;
        pbVar2[3] = false;
        pbVar2[7] = false;
      }
    }
  }
  return;
}

Assistant:

void aggreports::LoadPeriodsToWeighting() {

  FILE *fin = fopen(PERIODS_FILE, "rb");
  if (fin == nullptr) return;

  Periods p;
  while (fread(&p, sizeof(Periods), 1, fin) != 0) {
    periodstoweighting_[p.period_no] = p.weighting;
  }

  // User must define return periods if he/she wishes to use non-uniform period
  // weights for Wheatsheaf/per sample mean output
  if (outputFlags_[AGG_WHEATSHEAF_MEAN] == true ||
      outputFlags_[OCC_WHEATSHEAF_MEAN] == true) {
    if (periodstoweighting_.size() > 0 && useReturnPeriodFile_ == false) {
      logprintf(progname_, "WARNING", "Return periods file must be present if "
				      "you wish to use non-uniform period "
				      "weights for Wheatsheaf mean/per sample "
				      "mean output.\n");
      logprintf(progname_, "INFO", "Wheatsheaf mean/per sample mean output "
				   "will not be produced.\n");
      outputFlags_[AGG_WHEATSHEAF_MEAN] = false;
      outputFlags_[OCC_WHEATSHEAF_MEAN] = false;
    } else if (periodstoweighting_.size() > 0 && ordFlag_ == true) {
      logprintf(progname_, "INFO", "Tail Value at Risk for Wheatsheaf mean/per "
				   "sample mean is not supported if you wish "
				   "to use non-uniform period weights..\n");
    }
  }

}